

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O2

int strpool_internal_add_block(strpool_t *pool,int size)

{
  int iVar1;
  int iVar2;
  strpool_internal_block_t *psVar3;
  char *pcVar4;
  
  iVar2 = pool->block_count;
  iVar1 = pool->block_capacity;
  if (iVar2 < iVar1) {
    psVar3 = pool->blocks;
  }
  else {
    pool->block_capacity = iVar1 * 2;
    psVar3 = (strpool_internal_block_t *)
             (**pool->memctx)(0,(long)iVar1 << 6,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    if (psVar3 == (strpool_internal_block_t *)0x0) {
      __assert_fail("new_blocks",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x216,"int strpool_internal_add_block(strpool_t *, int)");
    }
    memcpy(psVar3,pool->blocks,(long)pool->block_count << 5);
    (**pool->memctx)(pool->blocks,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    pool->blocks = psVar3;
    iVar2 = pool->block_count;
  }
  psVar3[iVar2].capacity = size;
  pcVar4 = (char *)(**pool->memctx)(0,(long)size,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  psVar3 = pool->blocks;
  iVar2 = pool->block_count;
  psVar3[iVar2].data = pcVar4;
  if (pcVar4 != (char *)0x0) {
    psVar3[iVar2].tail = pcVar4;
    psVar3[iVar2].free_list = -1;
    pool->block_count = iVar2 + 1;
    return iVar2;
  }
  __assert_fail("pool->blocks[ pool->block_count ].data",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                ,0x21d,"int strpool_internal_add_block(strpool_t *, int)");
}

Assistant:

static int strpool_internal_add_block( strpool_t* pool, int size )
    {
    if( pool->block_count >= pool->block_capacity ) 
        {
        pool->block_capacity *= 2;
        strpool_internal_block_t* new_blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
            pool->block_capacity * sizeof( *pool->blocks ) );
        STRPOOL_ASSERT( new_blocks );
        STRPOOL_MEMCPY( new_blocks, pool->blocks, pool->block_count * sizeof( *pool->blocks ) );
        STRPOOL_FREE( pool->memctx, pool->blocks );
        pool->blocks = new_blocks;
        }
    pool->blocks[ pool->block_count ].capacity = size;
    pool->blocks[ pool->block_count ].data = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) size );
    STRPOOL_ASSERT( pool->blocks[ pool->block_count ].data );
    pool->blocks[ pool->block_count ].tail = pool->blocks[ pool->block_count ].data;
    pool->blocks[ pool->block_count ].free_list = -1;
    return pool->block_count++;
    }